

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDY0xac(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_addr(this);
  LDY(this,argument);
  return 4;
}

Assistant:

int CPU::instrLDY0xac() {
	LDY(absolute_addr());
	return 4;
}